

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3AnalysisLoad(sqlite3 *db,int iDb)

{
  uint *puVar1;
  byte *pbVar2;
  Schema *pSVar3;
  int iVar4;
  Table *pTVar5;
  char *zSql;
  HashElem *pHVar6;
  analysisInfo sInfo;
  sqlite3 *local_30;
  char *local_28;
  
  pSVar3 = db->aDb[iDb].pSchema;
  for (pHVar6 = (pSVar3->tblHash).first; pHVar6 != (HashElem *)0x0; pHVar6 = pHVar6->next) {
    puVar1 = (uint *)((long)pHVar6->data + 0x40);
    *puVar1 = *puVar1 & 0xffffffef;
  }
  for (pHVar6 = (pSVar3->idxHash).first; pHVar6 != (HashElem *)0x0; pHVar6 = pHVar6->next) {
    pbVar2 = (byte *)((long)pHVar6->data + 99);
    *pbVar2 = *pbVar2 & 0x7f;
  }
  local_28 = db->aDb[iDb].zDbSName;
  local_30 = db;
  pTVar5 = sqlite3FindTable(db,"sqlite_stat1",local_28);
  if (pTVar5 == (Table *)0x0) {
    iVar4 = 0;
  }
  else {
    zSql = sqlite3MPrintf(db,"SELECT tbl,idx,stat FROM %Q.sqlite_stat1",local_28);
    if (zSql == (char *)0x0) {
      iVar4 = 7;
    }
    else {
      iVar4 = sqlite3_exec(db,zSql,analysisLoader,&local_30,(char **)0x0);
      sqlite3DbFreeNN(db,zSql);
    }
  }
  for (pHVar6 = (pSVar3->idxHash).first; pHVar6 != (HashElem *)0x0; pHVar6 = pHVar6->next) {
    if (-1 < (char)((Index *)pHVar6->data)->field_0x63) {
      sqlite3DefaultRowEst((Index *)pHVar6->data);
    }
  }
  if (((iVar4 == 7) && (db->mallocFailed == '\0')) && (db->bBenignMalloc == '\0')) {
    db->mallocFailed = '\x01';
    if (0 < db->nVdbeExec) {
      (db->u1).isInterrupted = 1;
    }
    (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3AnalysisLoad(sqlite3 *db, int iDb){
  analysisInfo sInfo;
  HashElem *i;
  char *zSql;
  int rc = SQLITE_OK;
  Schema *pSchema = db->aDb[iDb].pSchema;

  assert( iDb>=0 && iDb<db->nDb );
  assert( db->aDb[iDb].pBt!=0 );

  /* Clear any prior statistics */
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  for(i=sqliteHashFirst(&pSchema->tblHash); i; i=sqliteHashNext(i)){
    Table *pTab = sqliteHashData(i);
    pTab->tabFlags &= ~TF_HasStat1;
  }
  for(i=sqliteHashFirst(&pSchema->idxHash); i; i=sqliteHashNext(i)){
    Index *pIdx = sqliteHashData(i);
    pIdx->hasStat1 = 0;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    sqlite3DeleteIndexSamples(db, pIdx);
    pIdx->aSample = 0;
#endif
  }

  /* Load new statistics out of the sqlite_stat1 table */
  sInfo.db = db;
  sInfo.zDatabase = db->aDb[iDb].zDbSName;
  if( sqlite3FindTable(db, "sqlite_stat1", sInfo.zDatabase)!=0 ){
    zSql = sqlite3MPrintf(db, 
        "SELECT tbl,idx,stat FROM %Q.sqlite_stat1", sInfo.zDatabase);
    if( zSql==0 ){
      rc = SQLITE_NOMEM_BKPT;
    }else{
      rc = sqlite3_exec(db, zSql, analysisLoader, &sInfo, 0);
      sqlite3DbFree(db, zSql);
    }
  }

  /* Set appropriate defaults on all indexes not in the sqlite_stat1 table */
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  for(i=sqliteHashFirst(&pSchema->idxHash); i; i=sqliteHashNext(i)){
    Index *pIdx = sqliteHashData(i);
    if( !pIdx->hasStat1 ) sqlite3DefaultRowEst(pIdx);
  }

  /* Load the statistics from the sqlite_stat4 table. */
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( rc==SQLITE_OK && OptimizationEnabled(db, SQLITE_Stat34) ){
    db->lookaside.bDisable++;
    rc = loadStat4(db, sInfo.zDatabase);
    db->lookaside.bDisable--;
  }
  for(i=sqliteHashFirst(&pSchema->idxHash); i; i=sqliteHashNext(i)){
    Index *pIdx = sqliteHashData(i);
    sqlite3_free(pIdx->aiRowEst);
    pIdx->aiRowEst = 0;
  }
#endif

  if( rc==SQLITE_NOMEM ){
    sqlite3OomFault(db);
  }
  return rc;
}